

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

ENetPeer *
enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,enet_uint32 data)

{
  uint uVar1;
  ENetPeer *pEVar2;
  ENetPeer *pEVar3;
  enet_uint32 eVar4;
  size_t sVar5;
  ENetChannel *pEVar6;
  ENetPeer *pEVar7;
  ENetPeer *peer;
  size_t sVar8;
  bool bVar9;
  ENetProtocol command;
  ENetProtocol local_60;
  
  sVar5 = 0xff;
  if (channelCount < 0xff) {
    sVar5 = channelCount;
  }
  sVar8 = 1;
  if (channelCount != 0) {
    sVar8 = sVar5;
  }
  sVar5 = host->peerCount;
  bVar9 = 0 < (long)sVar5;
  if ((long)sVar5 < 1) {
    return (ENetPeer *)0x0;
  }
  peer = host->peers;
  if (peer->state != ENET_PEER_STATE_DISCONNECTED) {
    pEVar7 = peer + sVar5;
    pEVar2 = peer;
    do {
      peer = pEVar2 + 1;
      bVar9 = peer < pEVar7;
      if (!bVar9) {
        return (ENetPeer *)0x0;
      }
      pEVar3 = pEVar2 + 1;
      pEVar2 = peer;
    } while (pEVar3->state != ENET_PEER_STATE_DISCONNECTED);
  }
  if (!bVar9) {
    return (ENetPeer *)0x0;
  }
  pEVar6 = (ENetChannel *)enet_malloc(sVar8 * 0x50);
  peer->channels = pEVar6;
  if (pEVar6 == (ENetChannel *)0x0) {
    return (ENetPeer *)0x0;
  }
  peer->channelCount = sVar8;
  peer->state = ENET_PEER_STATE_CONNECTING;
  peer->address = *address;
  eVar4 = host->randomSeed + 1;
  host->randomSeed = eVar4;
  peer->connectID = eVar4;
  eVar4 = 0x10000;
  uVar1 = host->outgoingBandwidth >> 4 & 0xffff000;
  if (host->outgoingBandwidth == 0) {
    uVar1 = 0x10000;
  }
  peer->windowSize = uVar1;
  if (uVar1 == 0) {
    eVar4 = 0x1000;
  }
  else if (uVar1 < 0x10001) goto LAB_0015e9a2;
  peer->windowSize = eVar4;
LAB_0015e9a2:
  if (sVar8 != 0) {
    pEVar6 = peer->channels;
    do {
      pEVar6->outgoingReliableSequenceNumber = 0;
      pEVar6->outgoingUnreliableSequenceNumber = 0;
      pEVar6->incomingReliableSequenceNumber = 0;
      pEVar6->incomingUnreliableSequenceNumber = 0;
      enet_list_clear(&pEVar6->incomingReliableCommands);
      enet_list_clear(&pEVar6->incomingUnreliableCommands);
      pEVar6->reliableWindows[7] = 0;
      pEVar6->reliableWindows[8] = 0;
      pEVar6->reliableWindows[9] = 0;
      pEVar6->reliableWindows[10] = 0;
      pEVar6->reliableWindows[0xb] = 0;
      pEVar6->reliableWindows[0xc] = 0;
      pEVar6->reliableWindows[0xd] = 0;
      pEVar6->reliableWindows[0xe] = 0;
      pEVar6->usedReliableWindows = 0;
      pEVar6->reliableWindows[0] = 0;
      pEVar6->reliableWindows[1] = 0;
      pEVar6->reliableWindows[2] = 0;
      pEVar6->reliableWindows[3] = 0;
      pEVar6->reliableWindows[4] = 0;
      pEVar6->reliableWindows[5] = 0;
      pEVar6->reliableWindows[6] = 0;
      pEVar6->reliableWindows[0xf] = 0;
      pEVar6 = pEVar6 + 1;
    } while (pEVar6 < peer->channels + sVar8);
  }
  local_60._0_2_ = 0xff82;
  local_60.acknowledge.receivedReliableSequenceNumber =
       peer->incomingPeerID << 8 | peer->incomingPeerID >> 8;
  local_60.connect.incomingSessionID = peer->incomingSessionID;
  local_60.connect.outgoingSessionID = peer->outgoingSessionID;
  uVar1 = peer->mtu;
  local_60.connect.mtu =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = peer->windowSize;
  local_60.connect.windowSize =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  local_60.connect.channelCount = (int)sVar8 << 0x18;
  uVar1 = host->incomingBandwidth;
  local_60.connect.incomingBandwidth =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = host->outgoingBandwidth;
  local_60.connect.outgoingBandwidth =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = peer->packetThrottleInterval;
  local_60.connect.packetThrottleInterval =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = peer->packetThrottleAcceleration;
  local_60.connect.packetThrottleAcceleration =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = peer->packetThrottleDeceleration;
  local_60.connect.packetThrottleDeceleration =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  local_60.connect.connectID = peer->connectID;
  local_60.connect.data =
       data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
  enet_peer_queue_outgoing_command(peer,&local_60,(ENetPacket *)0x0,0,0);
  return peer;
}

Assistant:

ENetPeer *
enet_host_connect (ENetHost * host, const ENetAddress * address, size_t channelCount, enet_uint32 data)
{
    ENetPeer * currentPeer;
    ENetChannel * channel;
    ENetProtocol command;

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
    else
    if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

    for (currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
       if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
         break;
    }

    if (currentPeer >= & host -> peers [host -> peerCount])
      return NULL;

    currentPeer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (currentPeer -> channels == NULL)
      return NULL;
    currentPeer -> channelCount = channelCount;
    currentPeer -> state = ENET_PEER_STATE_CONNECTING;
    currentPeer -> address = * address;
    currentPeer -> connectID = ++ host -> randomSeed;

    if (host -> outgoingBandwidth == 0)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      currentPeer -> windowSize = (host -> outgoingBandwidth /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (currentPeer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (currentPeer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
         
    for (channel = currentPeer -> channels;
         channel < & currentPeer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }
        
    command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    command.header.channelID = 0xFF;
    command.connect.outgoingPeerID = ENET_HOST_TO_NET_16 (currentPeer -> incomingPeerID);
    command.connect.incomingSessionID = currentPeer -> incomingSessionID;
    command.connect.outgoingSessionID = currentPeer -> outgoingSessionID;
    command.connect.mtu = ENET_HOST_TO_NET_32 (currentPeer -> mtu);
    command.connect.windowSize = ENET_HOST_TO_NET_32 (currentPeer -> windowSize);
    command.connect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    command.connect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleInterval);
    command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleAcceleration);
    command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleDeceleration);
    command.connect.connectID = currentPeer -> connectID;
    command.connect.data = ENET_HOST_TO_NET_32 (data);
 
    enet_peer_queue_outgoing_command (currentPeer, & command, NULL, 0, 0);

    return currentPeer;
}